

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

void __thiscall
CRegexParser::build_interval
          (CRegexParser *this,re_machine *new_machine,re_machine *sub,int min_val,int max_val,
          int var_id,int shortest)

{
  uchar *puVar1;
  re_machine *prVar2;
  long lVar3;
  re_machine inner_machine;
  
  init_machine(this,new_machine);
  init_machine(this,&inner_machine);
  lVar3 = (long)inner_machine.init;
  if (shortest == 0) {
    set_trans(this,inner_machine.init,sub->init,RE_LOOP_BRANCH,L'\0');
    prVar2 = (re_machine *)&new_machine->final;
  }
  else {
    set_trans(this,inner_machine.init,new_machine->final,RE_LOOP_BRANCH,L'\0');
    prVar2 = sub;
  }
  set_trans(this,inner_machine.init,prVar2->init,RE_LOOP_BRANCH,L'\0');
  set_trans(this,sub->final,inner_machine.init,RE_EPSILON,L'\0');
  set_trans(this,new_machine->init,inner_machine.init,RE_ZERO_VAR,L'\0');
  this->tuple_arr_[new_machine->init].info.sub.minlen = var_id;
  this->tuple_arr_[lVar3].info.sub.minlen = var_id;
  this->tuple_arr_[lVar3].info.loop.loop_min = min_val;
  this->tuple_arr_[lVar3].info.loop.loop_max = max_val;
  if (shortest != 0) {
    puVar1 = &this->tuple_arr_[lVar3].flags;
    *puVar1 = *puVar1 | 0x10;
  }
  return;
}

Assistant:

void CRegexParser::build_interval(re_machine *new_machine,
                                  re_machine *sub, int min_val, int max_val,
                                  int var_id, int shortest)
{
    re_machine inner_machine;
    
    /* initialize the outer (new) machine */
    init_machine(new_machine);

    /* initialize the inner machine */
    init_machine(&inner_machine);

    /* 
     *   Set the loop transition into the submachine, and set the other to
     *   bypass the submachine.  If we have a 'shortest' modifier, take
     *   the bypass branch first, otherwise take the enter branch first. 
     */
    if (shortest)
    {
        set_trans(inner_machine.init, new_machine->final, RE_LOOP_BRANCH, 0);
        set_trans(inner_machine.init, sub->init, RE_LOOP_BRANCH, 0);
    }
    else
    {
        set_trans(inner_machine.init, sub->init, RE_LOOP_BRANCH, 0);
        set_trans(inner_machine.init, new_machine->final, RE_LOOP_BRANCH, 0);
    }

    /* 
     *   set the final transition of the submachine to come back to the
     *   loop branch point 
     */
    set_trans(sub->final, inner_machine.init, RE_EPSILON, 0);

    /* 
     *   set the outer machine to transition into the inner machine and
     *   zero the loop variable 
     */
    set_trans(new_machine->init, inner_machine.init, RE_ZERO_VAR, 0);

    /* set the variable ID in the ZERO_VAR node */
    tuple_arr_[new_machine->init].info.loop.loop_var = var_id;

    /* set up the loop parameters in the loop node */
    tuple_arr_[inner_machine.init].info.loop.loop_var = var_id;
    tuple_arr_[inner_machine.init].info.loop.loop_min = min_val;
    tuple_arr_[inner_machine.init].info.loop.loop_max = max_val;

    /* 
     *   if there's a 'shortest' modifier, note it in the loop node, so
     *   that we can take the bypass branch first whenever possible 
     */
    if (shortest)
        tuple_arr_[inner_machine.init].flags |= RE_STATE_SHORTEST;
}